

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerGLSL::should_suppress_usage_tracking(CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  undefined1 local_15;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  bVar1 = expression_is_forwarded(this,id);
  local_15 = true;
  if (bVar1) {
    local_15 = expression_suppresses_usage_tracking(this,id);
  }
  return local_15;
}

Assistant:

bool CompilerGLSL::should_suppress_usage_tracking(uint32_t id) const
{
	// Used only by opcodes which don't do any real "work", they just swizzle data in some fashion.
	return !expression_is_forwarded(id) || expression_suppresses_usage_tracking(id);
}